

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O3

void SHEvaluate(vec3f *w,int lmax,float *out)

{
  long lVar1;
  size_t __n;
  float *pfVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  void *__s;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  ulong local_58;
  float local_4c;
  long local_48;
  ulong local_40;
  void *local_38;
  
  if (0x1c < lmax) {
    uStack_70 = 0x17edfe;
    __assert_fail("lmax <= 28",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x84,"void SHEvaluate(const vec3f &, int, float *)");
  }
  fVar16 = w->z;
  fVar19 = SQRT(w->x * w->x + w->y * w->y + fVar16 * fVar16);
  if ((fVar19 <= 0.995) || (1.005 <= fVar19)) {
    uStack_70 = 0x17ee1d;
    __assert_fail("norm(w) > .995f && norm(w) < 1.005f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                  ,0x8c,"void SHEvaluate(const vec3f &, int, float *)");
  }
  *out = 1.0;
  out[2] = fVar16;
  iVar3 = 3;
  iVar4 = 0;
  do {
    iVar9 = iVar4 + 2;
    if (lmax < iVar9) {
      if (0 < lmax) {
        fVar20 = 1.0;
        fVar19 = 1.0 - fVar16 * fVar16;
        if (fVar19 <= 0.0) {
          fVar19 = 0.0;
        }
        fVar22 = -1.0;
        iVar4 = 1;
        iVar3 = 3;
        fVar23 = SQRT(fVar19);
        do {
          fVar24 = fVar20 * fVar22 * fVar23;
          out[(iVar4 + 2) * iVar4] = fVar24;
          if (NAN(fVar24)) {
            uStack_70 = 0x17edc0;
            __assert_fail("!isnan(P(l, l))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                          ,0x59,"void legendrep(float, int, float *)");
          }
          if (ABS(fVar24) == INFINITY) {
            uStack_70 = 0x17eddf;
            __assert_fail("!isinf(P(l, l))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                          ,0x5a,"void legendrep(float, int, float *)");
          }
          iVar4 = iVar4 + 1;
          fVar22 = -fVar22;
          fVar20 = fVar20 * (float)iVar3;
          fVar23 = fVar23 * SQRT(fVar19);
          iVar3 = iVar3 + 2;
        } while (iVar4 <= lmax);
      }
      iVar4 = 3;
      iVar3 = 3;
      do {
        if (lmax < iVar4 + -1) {
          local_68 = w;
          uVar5 = lmax + 1;
          local_40 = (ulong)(uint)lmax;
          local_58 = (ulong)uVar5;
          if (2 < lmax) {
            iVar4 = 2;
            lVar10 = 0;
            uVar15 = 3;
            do {
              iVar9 = (int)uVar15;
              uVar8 = uVar15 + 1;
              lVar13 = -1;
              iVar3 = iVar4;
              do {
                fVar19 = (*(float *)((long)out +
                                    lVar13 * 4 +
                                    ((long)((uVar15 << 0x20) * (uVar15 + 0xffffffff)) >> 0x1e) + 8)
                          * (float)(iVar9 * 2 + -1) * fVar16 -
                         (float)(iVar9 + (int)lVar13 + 1) *
                         out[(long)((iVar9 + -1) * (iVar9 + -2)) + lVar13 + 2]) / (float)iVar3;
                *(float *)((long)out + lVar13 * 4 + ((long)((uVar15 << 0x20) * uVar8) >> 0x1e) + 8)
                     = fVar19;
                if (NAN(fVar19)) {
                  uStack_70 = 0x17ece7;
                  __assert_fail("!isnan(P(l, m))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                ,0x6e,"void legendrep(float, int, float *)");
                }
                if (ABS(fVar19) == INFINITY) {
                  uStack_70 = 0x17ecc8;
                  __assert_fail("!isinf(P(l, m))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                ,0x6f,"void legendrep(float, int, float *)");
                }
                lVar13 = lVar13 + 1;
                iVar3 = iVar3 + -1;
              } while (lVar10 + lVar13 != 0);
              lVar10 = lVar10 + -1;
              iVar4 = iVar4 + 1;
              uVar15 = uVar8;
            } while (uVar8 != uVar5);
          }
          local_60 = out;
          lVar10 = -((ulong)(uVar5 * uVar5) * 4 + 0xf & 0x3fffffff0);
          lVar13 = (long)&local_68 + lVar10;
          local_48 = lVar13;
          if (-1 < lmax) {
            iVar4 = 1;
            uVar15 = 0;
            lVar7 = 0;
            do {
              iVar3 = (int)uVar15;
              fVar16 = (float)iVar3;
              local_38 = (void *)CONCAT44(local_38._4_4_,fVar16);
              fVar16 = (fVar16 + fVar16 + 1.0) * 0.07957747;
              lVar1 = local_48 + (long)((iVar3 + 1) * iVar3) * 4;
              local_4c = fVar16;
              lVar14 = lVar7;
              do {
                fVar19 = 1.0;
                if (lVar14 != 0) {
                  fVar20 = local_38._0_4_ - ABS((float)(int)lVar14);
                  while (fVar20 = fVar20 + 1.0, fVar20 <= ABS((float)(int)lVar14) + local_38._0_4_)
                  {
                    fVar19 = fVar19 * fVar20;
                  }
                  fVar19 = 1.0 / fVar19;
                }
                fVar19 = fVar19 * fVar16;
                if (fVar19 < 0.0) {
                  *(undefined8 *)((long)&uStack_70 + lVar10) = 0x17e921;
                  fVar19 = sqrtf(fVar19);
                  fVar16 = local_4c;
                }
                else {
                  fVar19 = SQRT(fVar19);
                }
                *(float *)(lVar1 + lVar14 * 4) = fVar19;
                lVar14 = lVar14 + 1;
              } while (iVar4 != (int)lVar14);
              uVar15 = uVar15 + 1;
              lVar7 = lVar7 + -1;
              iVar4 = iVar4 + 1;
            } while (uVar15 != local_58);
          }
          uVar8 = local_40;
          uVar15 = local_58;
          uVar6 = local_58 * 4 + 0xf & 0xfffffffffffffff0;
          __s = (void *)(lVar13 - uVar6);
          local_38 = __s;
          fVar19 = 1.0;
          fVar16 = 1.0 - local_68->z * local_68->z;
          if (fVar16 <= 0.0) {
            fVar16 = 0.0;
          }
          fVar16 = SQRT(fVar16);
          iVar3 = (int)local_58;
          iVar4 = (int)local_40;
          if ((fVar16 != 0.0) || (NAN(fVar16))) {
            if (-1 < iVar4) {
              fVar20 = local_68->y / fVar16;
              fVar16 = local_68->x / fVar16;
              fVar23 = 0.0;
              lVar10 = 0;
              do {
                *(float *)((long)__s + lVar10 * 4) = fVar23;
                *(float *)((long)__s + (lVar10 * 4 - uVar6)) = fVar19;
                fVar22 = fVar20 * fVar23;
                fVar23 = fVar23 * fVar16 + fVar20 * fVar19;
                fVar19 = fVar19 * fVar16 - fVar22;
                lVar10 = lVar10 + 1;
              } while (iVar3 != (int)lVar10);
            }
          }
          else if (-1 < iVar4) {
            __n = local_58 * 4;
            lVar10 = 0;
            *(undefined8 *)((long)__s + (-8 - uVar6)) = 0x17e9e4;
            memset(__s,0,__n);
            lVar13 = uVar15 - 1;
            auVar17._8_4_ = (int)lVar13;
            auVar17._0_8_ = lVar13;
            auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
            auVar17 = auVar17 ^ _DAT_0018e590;
            auVar18 = _DAT_0018e8a0;
            auVar21 = _DAT_0018e700;
            do {
              auVar25 = auVar21 ^ _DAT_0018e590;
              iVar9 = auVar17._4_4_;
              if ((bool)(~(auVar25._4_4_ == iVar9 && auVar17._0_4_ < auVar25._0_4_ ||
                          iVar9 < auVar25._4_4_) & 1)) {
                *(undefined4 *)((long)__s + (lVar10 - uVar6)) = 0x3f800000;
              }
              if ((auVar25._12_4_ != auVar17._12_4_ || auVar25._8_4_ <= auVar17._8_4_) &&
                  auVar25._12_4_ <= auVar17._12_4_) {
                *(undefined4 *)((long)__s + lVar10 + (4 - uVar6)) = 0x3f800000;
              }
              iVar11 = SUB164(auVar18 ^ _DAT_0018e590,4);
              if (iVar11 <= iVar9 &&
                  (iVar11 != iVar9 || SUB164(auVar18 ^ _DAT_0018e590,0) <= auVar17._0_4_)) {
                *(undefined4 *)((long)__s + lVar10 + (8 - uVar6)) = 0x3f800000;
                *(undefined4 *)((long)__s + lVar10 + (0xc - uVar6)) = 0x3f800000;
              }
              lVar13 = auVar21._8_8_;
              auVar21._0_8_ = auVar21._0_8_ + 4;
              auVar21._8_8_ = lVar13 + 4;
              lVar13 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 4;
              auVar18._8_8_ = lVar13 + 4;
              lVar10 = lVar10 + 0x10;
            } while ((ulong)(iVar3 + 3U >> 2) << 4 != lVar10);
          }
          pfVar2 = local_60;
          if (SHEvaluate(vec3f_const&,int,float*)::sqrt2 == '\0') {
            *(undefined8 *)((long)__s + (-8 - uVar6)) = 0x17ee22;
            SHEvaluate();
          }
          fVar16 = SHEvaluate::sqrt2;
          if (-1 < iVar4) {
            uVar5 = 1;
            iVar3 = 0;
            iVar9 = 0;
            iVar4 = 0;
            do {
              if (iVar4 < 1) {
                lVar10 = (long)((iVar4 + 1) * iVar4);
              }
              else {
                pfVar12 = (float *)((long)local_38 + (long)iVar9 * -4);
                iVar11 = (iVar4 + 1) * iVar4;
                lVar10 = (long)iVar11;
                iVar11 = iVar3 + iVar11;
                lVar13 = (long)iVar9;
                do {
                  lVar7 = lVar13 + 1;
                  fVar19 = *(float *)(local_48 + lVar10 * 4 + -4 + lVar7 * 4) * fVar16 *
                           pfVar2[iVar11] * *pfVar12;
                  pfVar2[lVar10 + lVar13] = fVar19;
                  if (NAN(fVar19)) {
                    *(undefined8 *)((long)__s + (-8 - uVar6)) = 0x17ed25;
                    __assert_fail("!isnan(out[SHIndex(l,m)])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                  ,0xa6,"void SHEvaluate(const vec3f &, int, float *)");
                  }
                  if (ABS(fVar19) == INFINITY) {
                    *(undefined8 *)((long)__s + (-8 - uVar6)) = 0x17ed06;
                    __assert_fail("!isinf(out[SHIndex(l,m)])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                  ,0xa7,"void SHEvaluate(const vec3f &, int, float *)");
                  }
                  pfVar12 = pfVar12 + -1;
                  iVar11 = iVar11 + -1;
                  uVar8 = local_40;
                  lVar13 = lVar7;
                } while ((int)lVar7 != 0);
              }
              iVar11 = iVar4 + 1;
              pfVar2[lVar10] = *(float *)(local_48 + lVar10 * 4) * pfVar2[lVar10];
              if (iVar4 != 0) {
                uVar15 = 1;
                do {
                  fVar19 = *(float *)(local_48 + lVar10 * 4 + uVar15 * 4) * fVar16 *
                           *(float *)((long)__s + (uVar15 * 4 - uVar6)) * pfVar2[lVar10 + uVar15];
                  pfVar2[lVar10 + uVar15] = fVar19;
                  if (NAN(fVar19)) {
                    *(undefined8 *)((long)__s + (-8 - uVar6)) = 0x17ed63;
                    __assert_fail("!isnan(out[SHIndex(l,m)])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                  ,0xad,"void SHEvaluate(const vec3f &, int, float *)");
                  }
                  if (ABS(fVar19) == INFINITY) {
                    *(undefined8 *)((long)__s + (-8 - uVar6)) = 0x17ed44;
                    __assert_fail("!isinf(out[SHIndex(l,m)])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                  ,0xae,"void SHEvaluate(const vec3f &, int, float *)");
                  }
                  uVar15 = uVar15 + 1;
                } while (uVar5 != uVar15);
              }
              iVar9 = iVar9 + -1;
              uVar5 = uVar5 + 1;
              iVar3 = iVar3 + 1;
              iVar4 = iVar11;
            } while (iVar11 <= (int)uVar8);
          }
          return;
        }
        fVar19 = (float)iVar3 * fVar16 * out[(iVar4 + -2) * iVar4];
        out[(iVar4 + -1) * iVar4 + iVar4 + -2] = fVar19;
        if (NAN(fVar19)) {
          uStack_70 = 0x17eda1;
          __assert_fail("!isnan(P(l, l-1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                        ,100,"void legendrep(float, int, float *)");
        }
        iVar3 = iVar3 + 2;
        iVar4 = iVar4 + 1;
      } while (ABS(fVar19) != INFINITY);
      uStack_70 = 0x17e72e;
      __assert_fail("!isinf(P(l, l-1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                    ,0x65,"void legendrep(float, int, float *)");
    }
    iVar11 = iVar4 + 1;
    fVar19 = ((float)iVar3 * fVar16 * out[iVar11 * iVar9] - (float)(iVar4 + 1) * out[iVar11 * iVar4]
             ) / (float)iVar9;
    out[(iVar4 + 3) * iVar9] = fVar19;
    if (NAN(fVar19)) {
      uStack_70 = 0x17ed82;
      __assert_fail("!isnan(P(l, 0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                    ,0x4e,"void legendrep(float, int, float *)");
    }
    iVar3 = iVar3 + 2;
    iVar4 = iVar11;
  } while (ABS(fVar19) != INFINITY);
  uStack_70 = 0x17e612;
  __assert_fail("!isinf(P(l, 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                ,0x4f,"void legendrep(float, int, float *)");
}

Assistant:

void SHEvaluate(const vec3f &w, int lmax, float *out) {
    assert(lmax <= 28);
    // if (lmax > 28) {
    //     console.error("SHEvaluate() runs out of numerical precision for lmax > 28. "
    //            "If you need more bands, try recompiling using doubles.");
    //     exit(1);
    // }

    // Compute Legendre polynomial values for $\cos\theta$
    assert(norm(w) > .995f && norm(w) < 1.005f);
    legendrep(w.z, lmax, out);

    // Compute $K_l^m$ coefficients
    float Klm[SHTerms(lmax)];
    for (int l = 0; l <= lmax; ++l)
        for (int m = -l; m <= l; ++m)
            Klm[SHIndex(l, m)] = K(l, m);

    // Compute $\sin\phi$ and $\cos\phi$ values
    float sins[lmax+1], coss[lmax+1];
    float xyLen = sqrtf(fmax(0.f, 1.f - w.z*w.z));
    if (xyLen == 0.f) {
        for (int i = 0; i <= lmax; ++i) sins[i] = 0.f;
        for (int i = 0; i <= lmax; ++i) coss[i] = 1.f;
    }
    else
        sinCosIndexed(w.y / xyLen, w.x / xyLen, lmax+1, sins, coss);

    // Apply SH definitions to compute final $(l,m)$ values
    static const float sqrt2 = sqrtf(2.f);
    for (int l = 0; l <= lmax; ++l) {
        for (int m = -l; m < 0; ++m)
        {
            out[SHIndex(l, m)] = sqrt2 * Klm[SHIndex(l, m)] *
                out[SHIndex(l, -m)] * sins[-m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
        out[SHIndex(l, 0)] *= Klm[SHIndex(l, 0)];
        for (int m = 1; m <= l; ++m)
        {
            out[SHIndex(l, m)] *= sqrt2 * Klm[SHIndex(l, m)] * coss[m];
            assert(!isnan(out[SHIndex(l,m)]));
            assert(!isinf(out[SHIndex(l,m)]));
        }
    }
}